

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

errr grab_index_and_int(int *value,int *index,char **value_type,char *prefix,char *name_and_value)

{
  _Bool _Var1;
  int iVar2;
  char *value_name_00;
  size_t sVar3;
  char *local_50;
  char *value_string;
  char *value_name;
  int i;
  char *name_and_value_local;
  char *prefix_local;
  char **value_type_local;
  int *index_local;
  int *value_local;
  
  value_name_00 = string_make(name_and_value);
  local_50 = string_make(prefix);
  _Var1 = find_value_arg(value_name_00,(char *)0x0,0,value);
  if (_Var1) {
    for (value_name._4_4_ = 0; value_type[value_name._4_4_] != (char *)0x0;
        value_name._4_4_ = value_name._4_4_ + 1) {
      local_50 = string_append(local_50,value_type[value_name._4_4_]);
      iVar2 = strcmp(local_50,value_name_00);
      if (iVar2 == 0) break;
      sVar3 = strlen(prefix);
      my_strcpy(local_50,prefix,sVar3 + 1);
    }
    free(local_50);
    free(value_name_00);
    if (value_type[value_name._4_4_] != (char *)0x0) {
      *index = value_name._4_4_;
    }
    value_local._4_4_ = 5;
    if (value_type[value_name._4_4_] != (char *)0x0) {
      value_local._4_4_ = 0;
    }
  }
  else {
    string_free(local_50);
    string_free(value_name_00);
    value_local._4_4_ = 0x1e;
  }
  return value_local._4_4_;
}

Assistant:

errr grab_index_and_int(int *value, int *index, const char **value_type,
						const char *prefix, const char *name_and_value)
{
	int i;
	/* Get a rewritable string */
	char *value_name = string_make(name_and_value);
	char *value_string = string_make(prefix);

	/* Parse the value expression */
	if (!find_value_arg(value_name, NULL, 0, value)) {
		string_free(value_string);
		string_free(value_name);
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Compose the value string and look for it */
	for (i = 0; value_type[i]; i++) {
		value_string = string_append(value_string, value_type[i]);
		if (streq(value_string, value_name)) break;
		my_strcpy(value_string, prefix, strlen(prefix) + 1);
	}

	free(value_string);
	free(value_name);
	if (value_type[i])
		*index = i;

	return value_type[i] ? PARSE_ERROR_NONE : PARSE_ERROR_INTERNAL;
}